

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorPool::FindAllExtensions
          (DescriptorPool *this,Descriptor *extendee,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *out)

{
  pointer *pppFVar1;
  DescriptorDatabase *pDVar2;
  Tables *pTVar3;
  iterator __position;
  Descriptor **ppDVar4;
  Descriptor *pDVar5;
  int iVar6;
  long lVar7;
  const_iterator cVar8;
  _Rb_tree_node_base *p_Var9;
  _Rb_tree_node_base *p_Var10;
  _Node *p_Var11;
  ulong uVar12;
  _Rb_tree_header *p_Var13;
  _Hash_code_type __code;
  _Rb_tree_node_base *p_Var14;
  vector<int,_std::allocator<int>_> numbers;
  MutexLockMaybe lock;
  Descriptor *local_70;
  void *local_68;
  void *pvStack_60;
  long local_58;
  MutexLockMaybe local_50;
  key_type local_48;
  
  local_50.mu_ = this->mutex_;
  local_70 = extendee;
  if (local_50.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_50.mu_);
  }
  pDVar2 = this->fallback_database_;
  if (pDVar2 != (DescriptorDatabase *)0x0) {
    pTVar3 = (this->tables_).ptr_;
    if (pTVar3 == (Tables *)0x0) goto LAB_001cb37c;
    p_Var11 = (pTVar3->extensions_loaded_from_db_).
              super_unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              .
              super___unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>,_false>
              .
              super__Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
              ._M_buckets
              [(ulong)extendee %
               (pTVar3->extensions_loaded_from_db_).
               super_unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               .
               super___unordered_set<const_google::protobuf::Descriptor_*,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>,_false>
               .
               super__Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
               ._M_bucket_count];
    if (p_Var11 != (_Node *)0x0) {
      lVar7 = 0;
      do {
        ppDVar4 = &p_Var11->_M_v;
        p_Var11 = p_Var11->_M_next;
        lVar7 = lVar7 + (ulong)(*ppDVar4 == extendee);
      } while (p_Var11 != (_Hash_node<const_google::protobuf::Descriptor_*,_false> *)0x0);
      if (lVar7 != 0) goto LAB_001cb2b5;
    }
    local_68 = (void *)0x0;
    pvStack_60 = (void *)0x0;
    local_58 = 0;
    iVar6 = (*pDVar2->_vptr_DescriptorDatabase[5])(pDVar2,*(undefined8 *)(extendee + 8));
    if ((char)iVar6 != '\0') {
      if (pvStack_60 != local_68) {
        uVar12 = 0;
        do {
          pTVar3 = (this->tables_).ptr_;
          if (pTVar3 == (Tables *)0x0) goto LAB_001cb37c;
          iVar6 = *(int *)((long)local_68 + uVar12 * 4);
          local_48.first = local_70;
          local_48.second = iVar6;
          cVar8 = std::
                  _Rb_tree<std::pair<const_google::protobuf::Descriptor_*,_int>,_std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>,_std::less<std::pair<const_google::protobuf::Descriptor_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::Descriptor_*,_int>,_const_google::protobuf::FieldDescriptor_*>_>_>
                  ::find(&(pTVar3->extensions_)._M_t,&local_48);
          if (((_Rb_tree_header *)cVar8._M_node ==
               &(pTVar3->extensions_)._M_t._M_impl.super__Rb_tree_header) ||
             (cVar8._M_node[1]._M_left == (_Base_ptr)0x0)) {
            TryFindExtensionInFallbackDatabase(this,local_70,iVar6);
          }
          uVar12 = uVar12 + 1;
        } while (uVar12 < (ulong)((long)pvStack_60 - (long)local_68 >> 2));
      }
      pTVar3 = (this->tables_).ptr_;
      if (pTVar3 == (Tables *)0x0) goto LAB_001cb37c;
      std::tr1::
      _Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
      ::_M_insert(&local_48,
                  (_Hashtable<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::equal_to<const_google::protobuf::Descriptor_*>,_google::protobuf::hash<const_google::protobuf::Descriptor_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_true,_true>
                   *)&pTVar3->extensions_loaded_from_db_,&local_70);
    }
    if (local_68 != (void *)0x0) {
      operator_delete(local_68,local_58 - (long)local_68);
    }
  }
LAB_001cb2b5:
  pDVar5 = local_70;
  pTVar3 = (this->tables_).ptr_;
  if (pTVar3 != (Tables *)0x0) {
    p_Var9 = (pTVar3->extensions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var9 != (_Rb_tree_node_base *)0x0) {
      p_Var13 = &(pTVar3->extensions_)._M_t._M_impl.super__Rb_tree_header;
      p_Var14 = &p_Var13->_M_header;
      do {
        if ((*(Descriptor **)(p_Var9 + 1) < local_70) ||
           ((lVar7 = 0x10, p_Var10 = p_Var9, *(Descriptor **)(p_Var9 + 1) <= local_70 &&
            (*(int *)&p_Var9[1]._M_parent < 0)))) {
          lVar7 = 0x18;
          p_Var10 = p_Var14;
        }
        p_Var9 = *(_Rb_tree_node_base **)((long)&p_Var9->_M_color + lVar7);
        p_Var14 = p_Var10;
      } while (p_Var9 != (_Rb_tree_node_base *)0x0);
      for (; ((_Rb_tree_header *)p_Var10 != p_Var13 && (*(Descriptor **)(p_Var10 + 1) == pDVar5));
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        __position._M_current =
             (out->
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (out->
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)out,__position,(FieldDescriptor **)&p_Var10[1]._M_left);
        }
        else {
          *__position._M_current = (FieldDescriptor *)p_Var10[1]._M_left;
          pppFVar1 = &(out->
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
      }
    }
    if (this->underlay_ != (DescriptorPool *)0x0) {
      FindAllExtensions(this->underlay_,local_70,out);
    }
    internal::MutexLockMaybe::~MutexLockMaybe(&local_50);
    return;
  }
LAB_001cb37c:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                ,0x1e2,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

void DescriptorPool::FindAllExtensions(
    const Descriptor* extendee, vector<const FieldDescriptor*>* out) const {
  MutexLockMaybe lock(mutex_);

  // Initialize tables_->extensions_ from the fallback database first
  // (but do this only once per descriptor).
  if (fallback_database_ != NULL &&
      tables_->extensions_loaded_from_db_.count(extendee) == 0) {
    vector<int> numbers;
    if (fallback_database_->FindAllExtensionNumbers(extendee->full_name(),
                                                    &numbers)) {
      for (int i = 0; i < numbers.size(); ++i) {
        int number = numbers[i];
        if (tables_->FindExtension(extendee, number) == NULL) {
          TryFindExtensionInFallbackDatabase(extendee, number);
        }
      }
      tables_->extensions_loaded_from_db_.insert(extendee);
    }
  }

  tables_->FindAllExtensions(extendee, out);
  if (underlay_ != NULL) {
    underlay_->FindAllExtensions(extendee, out);
  }
}